

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O2

MessageFederate * __thiscall
helics::MessageFederate::operator=(MessageFederate *this,MessageFederate *mFed)

{
  std::
  __uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ::operator=((__uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
               *)&this->mfManager,
              (__uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
               *)&mFed->mfManager);
  if (*(int *)(&this->field_0x10 + (long)this->_vptr_MessageFederate[-3]) !=
      *(int *)(&mFed->field_0x10 + (long)mFed->_vptr_MessageFederate[-3])) {
    Federate::operator=((Federate *)
                        ((long)&this->_vptr_MessageFederate + (long)this->_vptr_MessageFederate[-3])
                        ,(Federate *)
                         ((long)&mFed->_vptr_MessageFederate + (long)mFed->_vptr_MessageFederate[-3]
                         ));
  }
  return this;
}

Assistant:

MessageFederate& MessageFederate::operator=(MessageFederate&& mFed) noexcept
{
    mfManager = std::move(mFed.mfManager);
    if (getID() != mFed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                    // it has moved already
        Federate::operator=(std::move(mFed));
    }
    return *this;
}